

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.c
# Opt level: O0

int mapBiomeEdge(Layer *l,int *out,int x,int z,int w,int h)

{
  int b;
  int v21_00;
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int v12;
  int v01;
  int v21;
  int v10;
  int v11;
  int *vz2;
  int *vz1;
  int *vz0;
  int err;
  int mc;
  int64_t j;
  int64_t i;
  int64_t pH;
  int64_t pW;
  int pZ;
  int pX;
  int in_stack_ffffffffffffff5c;
  int in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff6c;
  int v12_00;
  int id;
  long local_50;
  long local_48;
  int local_4;
  
  lVar3 = (long)(in_R8D + 2);
  local_4 = (*(code *)**(undefined8 **)(in_RDI + 0x38))
                      (*(undefined8 *)(in_RDI + 0x38),in_RSI,in_EDX + -1,in_ECX + -1,lVar3,
                       (long)(in_R9D + 2));
  if (local_4 == 0) {
    for (local_50 = 0; local_50 < in_R9D; local_50 = local_50 + 1) {
      lVar4 = in_RSI + (local_50 + 1) * lVar3 * 4;
      lVar5 = in_RSI + (local_50 + 2) * lVar3 * 4;
      for (local_48 = 0; local_48 < in_R8D; local_48 = local_48 + 1) {
        iVar2 = *(int *)(lVar4 + 4 + local_48 * 4);
        id = *(int *)(in_RSI + local_50 * lVar3 * 4 + 4 + local_48 * 4);
        b = *(int *)(lVar4 + 8 + local_48 * 4);
        v12_00 = *(int *)(lVar4 + local_48 * 4);
        v21_00 = *(int *)(lVar5 + 4 + local_48 * 4);
        iVar1 = replaceEdge((int *)CONCAT44(in_stack_ffffffffffffff6c,0x26),
                            in_stack_ffffffffffffff64,iVar2,in_stack_ffffffffffffff5c,v21_00,0,
                            v12_00,id,(int)lVar5,(int)lVar4);
        if (((iVar1 == 0) &&
            (iVar1 = replaceEdge((int *)CONCAT44(in_stack_ffffffffffffff6c,0x27),
                                 in_stack_ffffffffffffff64,iVar2,in_stack_ffffffffffffff5c,v21_00,0,
                                 v12_00,id,(int)lVar5,(int)lVar4), iVar1 == 0)) &&
           (iVar1 = replaceEdge((int *)CONCAT44(in_stack_ffffffffffffff6c,0x20),
                                in_stack_ffffffffffffff64,iVar2,in_stack_ffffffffffffff5c,v21_00,0,
                                v12_00,id,(int)lVar5,(int)lVar4), iVar1 == 0)) {
          if (iVar2 == 2) {
            iVar2 = isAny4(0xc,id,b,v12_00,v21_00);
            if (iVar2 == 0) {
              *(undefined4 *)(in_RSI + (local_48 + local_50 * in_R8D) * 4) = 2;
            }
            else {
              *(undefined4 *)(in_RSI + (local_48 + local_50 * in_R8D) * 4) = 0x22;
            }
          }
          else if (iVar2 == 6) {
            iVar2 = isAny4(2,id,b,v12_00,v21_00);
            if (((iVar2 == 0) && (iVar2 = isAny4(0x1e,id,b,v12_00,v21_00), iVar2 == 0)) &&
               (iVar2 = isAny4(0xc,id,b,v12_00,v21_00), iVar2 == 0)) {
              iVar2 = isAny4(0x15,id,b,v12_00,v21_00);
              if ((iVar2 == 0) && (iVar2 = isAny4(0xa8,id,b,v12_00,v21_00), iVar2 == 0)) {
                *(undefined4 *)(in_RSI + (local_48 + local_50 * in_R8D) * 4) = 6;
              }
              else {
                *(undefined4 *)(in_RSI + (local_48 + local_50 * in_R8D) * 4) = 0x17;
              }
            }
            else {
              *(undefined4 *)(in_RSI + (local_48 + local_50 * in_R8D) * 4) = 1;
            }
          }
          else {
            *(int *)(in_RSI + (local_48 + local_50 * in_R8D) * 4) = iVar2;
          }
        }
      }
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int mapBiomeEdge(const Layer * l, int * out, int x, int z, int w, int h)
{
    int pX = x - 1;
    int pZ = z - 1;
    int64_t pW = w + 2;
    int64_t pH = h + 2;
    int64_t i, j;
    int mc = l->mc;

    int err = l->p->getMap(l->p, out, pX, pZ, pW, pH);
    if unlikely(err != 0)
        return err;

    for (j = 0; j < h; j++)
    {
        int *vz0 = out + (j+0)*pW;
        int *vz1 = out + (j+1)*pW;
        int *vz2 = out + (j+2)*pW;

        for (i = 0; i < w; i++)
        {
            int v11 = vz1[i+1];
            int v10 = vz0[i+1];
            int v21 = vz1[i+2];
            int v01 = vz1[i+0];
            int v12 = vz2[i+1];

            if (!replaceEdge(out, i + j*w, mc, v10, v21, v01, v12, v11, wooded_badlands_plateau, badlands) &&
                !replaceEdge(out, i + j*w, mc, v10, v21, v01, v12, v11, badlands_plateau, badlands) &&
                !replaceEdge(out, i + j*w, mc, v10, v21, v01, v12, v11, giant_tree_taiga, taiga))
            {
                if (v11 == desert)
                {
                    if (!isAny4(snowy_tundra, v10, v21, v01, v12))
                    {
                        out[i + j*w] = v11;
                    }
                    else
                    {
                        out[i + j*w] = wooded_mountains;
                    }
                }
                else if (v11 == swamp)
                {
                    if (!isAny4(desert, v10, v21, v01, v12) &&
                        !isAny4(snowy_taiga, v10, v21, v01, v12) &&
                        !isAny4(snowy_tundra, v10, v21, v01, v12))
                    {
                        if (!isAny4(jungle, v10, v21, v01, v12) &&
                            !isAny4(bamboo_jungle, v10, v21, v01, v12))
                            out[i + j*w] = v11;
                        else
                            out[i + j*w] = jungle_edge;
                    }
                    else
                    {
                        out[i + j*w] = plains;
                    }
                }
                else
                {
                    out[i + j*w] = v11;
                }
            }
        }
    }

    return 0;
}